

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O1

void __thiscall
amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::ccfcdoit<amrex::FilccCell>
          (GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy> *this,Box *bx,
          FArrayBox *dest,int dcomp,int numcomp,Geometry *geom,Real time,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,int bcomp,int orig_comp,
          FilccCell *fillfunc)

{
  Box *pBVar1;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  double *pdVar5;
  undefined8 uVar6;
  ulong uVar7;
  Box *pBVar8;
  double *pdVar9;
  Real RVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  Real *pRVar21;
  int iVar22;
  GeometryData *pGVar23;
  Real *pRVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  long lVar29;
  uint bitval;
  int sm_1;
  uint uVar30;
  byte bVar31;
  int iVar32;
  int iVar33;
  int iVar35;
  undefined1 auVar34 [16];
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  Box lhs;
  Box bx_2;
  Box bx_1;
  Box bx_8;
  int local_418;
  IndexType IStack_414;
  int iStack_410;
  uint auStack_40c [2];
  IndexType IStack_404;
  uint local_400;
  undefined8 local_3f0;
  Box local_3e8;
  ulong local_3c8;
  ulong local_3c0;
  int local_3b4;
  CoordType local_3b0;
  uint local_3ac;
  uint local_3a8;
  uint local_3a4;
  int local_3a0;
  int local_39c;
  undefined8 local_398;
  uint local_390;
  pointer local_388;
  ulong local_380;
  long local_378;
  anon_class_264_10_7336990c local_370;
  int aiStack_268 [2];
  int iStack_260;
  uint local_25c [3];
  IndexType IStack_250;
  long local_248;
  undefined1 local_240 [20];
  undefined1 auStack_22c [8];
  int iStack_224;
  undefined8 local_220;
  Dim3 local_218;
  undefined8 local_20c;
  int local_204;
  int iStack_200;
  int local_1fc [4];
  int iStack_1ec;
  int iStack_1e8;
  uint uStack_1e4;
  int aiStack_1e0 [2];
  IndexType IStack_1d8;
  uint local_1d4;
  pointer local_1d0;
  int local_1c8;
  int local_1c4;
  undefined1 auStack_1c0 [4];
  int local_1bc;
  uint local_1b8;
  Real local_1b4;
  int local_1ac;
  Real local_1a8;
  int local_1a0;
  uint local_19c;
  int local_198;
  undefined8 local_194;
  int local_18c [6];
  int local_174;
  undefined8 local_170;
  int iStack_168;
  uint uStack_164;
  Real local_160;
  uint local_158;
  undefined8 local_154;
  CoordType local_14c;
  uint local_148;
  int iStack_144;
  int local_140;
  int local_13c;
  undefined8 local_138;
  int local_130;
  uint local_12c;
  int local_128;
  int local_124;
  int local_120;
  uint local_11c [4];
  undefined8 local_10c;
  int local_104;
  undefined8 local_100;
  int local_f8;
  uint local_f4;
  long local_f0;
  Box *local_e8;
  double *local_e0;
  long local_d8;
  undefined1 local_d0 [16];
  long local_c0;
  Real local_b8;
  uint local_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined8 local_98;
  ulong local_90;
  Real local_88;
  Real RStack_80;
  Real local_78;
  Real RStack_70;
  Real local_68;
  Real RStack_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  bVar31 = 0;
  iVar16 = (bx->bigend).vect[0];
  uVar4 = *(undefined8 *)(bx->smallend).vect;
  iVar27 = (int)uVar4;
  iVar32 = (int)((ulong)uVar4 >> 0x20);
  uVar30 = (iVar16 - iVar27) + 1;
  uVar4 = *(undefined8 *)((bx->bigend).vect + 1);
  iVar33 = (int)uVar4;
  iVar35 = (int)((ulong)uVar4 >> 0x20);
  iVar19 = (iVar33 - iVar32) + 1;
  iVar28 = (bx->smallend).vect[2];
  local_390 = (iVar35 - iVar28) + 1;
  local_398 = CONCAT44(iVar19,uVar30);
  uVar2 = (bx->btype).itype;
  uVar4 = *(undefined8 *)(geom->domain).smallend.vect;
  uVar6 = *(undefined8 *)((geom->domain).smallend.vect + 2);
  local_25c[1] = (uint)((ulong)*(undefined8 *)(geom->domain).bigend.vect >> 0x20);
  stack0xfffffffffffffdac = *(undefined8 *)((geom->domain).bigend.vect + 2);
  aiStack_268[0] = (int)uVar4;
  aiStack_268[1] = SUB84(uVar4,4);
  iStack_260 = (int)uVar6;
  local_25c[0] = (uint)((ulong)uVar6 >> 0x20);
  lVar15 = 0;
  do {
    uVar20 = 1 << ((byte)lVar15 & 0x1f);
    uVar25 = (uint)lVar15;
    local_25c[lVar15] =
         (local_25c[lVar15] + (uint)((uVar2 >> (uVar25 & 0x1f) & 1) != 0)) -
         (uint)((IStack_250.itype >> (uVar25 & 0x1f) & 1) != 0);
    if ((uVar2 >> (uVar25 & 0x1f) & 1) == 0) {
      local_400 = ~uVar20 & IStack_250.itype;
    }
    else {
      local_400 = uVar20 | IStack_250.itype;
    }
    IStack_250.itype = local_400;
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  auStack_40c[1] = local_25c[1];
  IStack_404.itype = local_25c[2];
  local_418 = (int)uVar4;
  IStack_414.itype = SUB84(uVar4,4);
  iStack_410 = iStack_260;
  auStack_40c[0] = local_25c[0];
  lVar15 = 0;
  do {
    if (*(char *)((long)(geom->super_CoordSys).inv_dx + lVar15 + 0x19) == '\x01') {
      iVar3 = *(int *)((long)&local_398 + lVar15 * 4);
      (&local_418)[lVar15] = (&local_418)[lVar15] - iVar3;
      auStack_40c[lVar15] = auStack_40c[lVar15] + iVar3;
    }
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  auVar34._0_4_ = -(uint)((int)auStack_40c[1] < iVar33);
  auVar34._4_4_ = -(uint)((int)IStack_404.itype < iVar35);
  auVar34._8_4_ = -(uint)(iVar27 < local_418);
  auVar34._12_4_ = -(uint)(iVar32 < (int)IStack_414.itype);
  iVar27 = movmskps(iVar16,auVar34);
  if (((iVar27 != 0) || ((int)auStack_40c[0] < iVar16)) || (iVar28 < iStack_410)) {
    local_e8 = bx;
    pdVar5 = (dest->super_BaseFab<double>).dptr;
    local_e0 = pdVar5;
    local_3b4 = (dest->super_BaseFab<double>).nvar;
    pBVar1 = &(dest->super_BaseFab<double>).domain;
    iVar16 = (dest->super_BaseFab<double>).domain.smallend.vect[1];
    local_d0._0_8_ = *(undefined8 *)(pBVar1->smallend).vect;
    iVar28 = (dest->super_BaseFab<double>).domain.smallend.vect[2];
    lVar29 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[0];
    local_68 = (geom->prob_domain).xhi[1];
    RStack_60 = (geom->prob_domain).xhi[2];
    local_78 = (geom->prob_domain).xlo[2];
    RStack_70 = (geom->prob_domain).xhi[0];
    local_88 = (geom->prob_domain).xlo[0];
    RStack_80 = (geom->prob_domain).xlo[1];
    uVar4 = *(undefined8 *)(geom->domain).bigend.vect;
    local_58 = *(undefined8 *)(geom->domain).smallend.vect;
    uStack_50 = (undefined4)*(undefined8 *)((geom->domain).smallend.vect + 2);
    uStack_4c = (undefined4)uVar4;
    uStack_48 = (undefined4)((ulong)uVar4 >> 0x20);
    uStack_44 = *(undefined8 *)((geom->domain).bigend.vect + 2);
    local_a8 = *(undefined4 *)(geom->super_CoordSys).dx;
    uStack_a4 = *(undefined4 *)((long)(geom->super_CoordSys).dx + 4);
    uStack_a0 = *(undefined4 *)((geom->super_CoordSys).dx + 1);
    uStack_9c = *(undefined4 *)((long)(geom->super_CoordSys).dx + 0xc);
    local_d0._8_8_ = (geom->super_CoordSys).dx[2];
    local_3a4 = (uint)(byte)(geom->super_CoordSys).field_0x51;
    local_3a8 = (uint)(byte)(geom->super_CoordSys).field_0x52;
    local_3ac = (uint)(byte)(geom->super_CoordSys).field_0x53;
    local_3b0 = (geom->super_CoordSys).c_sys;
    local_388 = (bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_3f0 = (ulong)uVar30;
    local_370._0_4_ = local_418 - uVar30;
    local_370._4_4_ = IStack_414.itype;
    local_370.fab.p._0_4_ = iStack_410;
    local_370.fab.p._4_4_ = local_418 + -1;
    lVar17 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    local_248 = (lVar29 - (pBVar1->smallend).vect[0]) + 1;
    local_c0 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    local_d8 = (long)iVar28;
    local_370.fab.jstride._0_4_ = auStack_40c[1];
    local_370.fab.jstride._4_4_ = IStack_404.itype;
    local_370.fab.kstride._0_4_ = local_400 & 0xfffffffe;
    lVar15 = 0;
    do {
      uVar20 = 1 << ((byte)lVar15 & 0x1f);
      uVar25 = (uint)lVar15;
      local_370.domain.smallend.vect[lVar15 + -0x11] =
           (local_370.domain.smallend.vect[lVar15 + -0x11] +
           (uint)((uVar2 >> (uVar25 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_370.fab.kstride >> (uVar25 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar25 & 0x1f) & 1) == 0) {
        local_370.fab.kstride._0_4_ = ~uVar20 & (uint)local_370.fab.kstride;
      }
      else {
        local_370.fab.kstride._0_4_ = uVar20 | (uint)local_370.fab.kstride;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    lVar18 = (lVar17 - iVar16) * local_248;
    local_370.fab.kstride._4_4_ = local_418;
    local_370.fab.nstride._0_4_ = IStack_414.itype - iVar19;
    local_370.fab.nstride._4_4_ = iStack_410;
    local_370.fab.begin.x = auStack_40c[0];
    local_370.fab.begin.y = IStack_414.itype - 1;
    local_370.fab.begin.z = IStack_404.itype;
    local_370.fab.end.x = local_400 & 0xfffffffd;
    lVar15 = 0;
    do {
      uVar20 = 1 << ((byte)lVar15 & 0x1f);
      uVar25 = (uint)lVar15;
      local_370.domain.smallend.vect[lVar15 + -10] =
           (local_370.domain.smallend.vect[lVar15 + -10] +
           (uint)((uVar2 >> (uVar25 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_370.fab.end.x >> (uVar25 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar25 & 0x1f) & 1) == 0) {
        local_370.fab.end.x = ~uVar20 & local_370.fab.end.x;
      }
      else {
        local_370.fab.end.x = uVar20 | local_370.fab.end.x;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_f0 = lVar18;
    local_378 = (local_c0 - iVar28) * lVar18;
    local_370.fab.end.y = local_418;
    local_370.fab.end.z = IStack_414.itype;
    local_370.fab.ncomp = iStack_410 - local_390;
    local_370.fab._60_4_ = auStack_40c[0];
    local_370.dcomp = auStack_40c[1];
    local_370.numcomp = iStack_410 + -1;
    local_370.domain.smallend.vect[0] = local_400 & 0xfffffffb;
    lVar15 = 0;
    do {
      uVar20 = 1 << ((byte)lVar15 & 0x1f);
      uVar25 = (uint)lVar15;
      *(uint *)((long)(&local_370.domain.smallend + -1) + lVar15 * 4) =
           (*(int *)((long)(&local_370.domain.smallend + -1) + lVar15 * 4) +
           (uint)((uVar2 >> (uVar25 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_370.domain.smallend.vect[0] >> (uVar25 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar25 & 0x1f) & 1) == 0) {
        local_370.domain.smallend.vect[0] = ~uVar20 & local_370.domain.smallend.vect[0];
      }
      else {
        local_370.domain.smallend.vect[0] = uVar20 | local_370.domain.smallend.vect[0];
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_380 = lVar17 << 0x20 | lVar29 + 1U & 0xffffffff;
    local_370.domain.smallend.vect[1] = (~local_400 & 1) + auStack_40c[0];
    local_370.domain.smallend.vect[2] = IStack_414.itype;
    local_370.domain.bigend.vect[0] = iStack_410;
    local_370.domain.bigend.vect[1] = uVar30 + local_370.domain.smallend.vect[1] + -1;
    local_370.domain.bigend.vect[2] = auStack_40c[1];
    local_370.domain.btype.itype = IStack_404.itype;
    local_370._108_4_ = local_400 & 0xfffffffe;
    lVar15 = 0;
    do {
      uVar25 = 1 << ((byte)lVar15 & 0x1f);
      uVar30 = (uint)lVar15;
      local_370.domain.bigend.vect[lVar15 + 1] =
           (local_370.domain.bigend.vect[lVar15 + 1] + (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0))
           - (uint)(((uint)local_370._108_4_ >> (uVar30 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
        local_370._108_4_ = ~uVar25 & local_370._108_4_;
      }
      else {
        local_370._108_4_ = uVar25 | local_370._108_4_;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    iVar16 = auStack_40c[1] + ((local_400 & 2) == 0);
    local_370.bcr_p = (BCRec *)CONCAT44(iVar16,local_418);
    local_370._120_4_ = iStack_410;
    local_370._124_4_ = auStack_40c[0];
    local_370.geomdata.prob_domain.xlo[0]._0_4_ = iVar19 + iVar16 + -1;
    local_370.geomdata.prob_domain.xlo[0]._4_4_ = IStack_404.itype;
    local_370.geomdata.prob_domain.xlo[1]._0_4_ = local_400 & 0xfffffffd;
    lVar15 = 0;
    do {
      uVar25 = 1 << ((byte)lVar15 & 0x1f);
      uVar30 = (uint)lVar15;
      *(uint *)((long)(&local_370.domain + 1) + lVar15 * 4 + 0x10) =
           (*(int *)((long)(&local_370.domain + 1) + lVar15 * 4 + 0x10) +
           (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0)) -
           (uint)((local_370.geomdata.prob_domain.xlo[1]._0_4_ >> (uVar30 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
        local_370.geomdata.prob_domain.xlo[1]._0_4_ =
             ~uVar25 & local_370.geomdata.prob_domain.xlo[1]._0_4_;
      }
      else {
        local_370.geomdata.prob_domain.xlo[1]._0_4_ =
             uVar25 | local_370.geomdata.prob_domain.xlo[1]._0_4_;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_370.geomdata.prob_domain.xlo[2]._0_4_ = IStack_414.itype;
    local_370.geomdata.prob_domain.xlo[1]._4_4_ = local_418;
    local_370.geomdata.prob_domain.xlo[2]._4_4_ = IStack_404.itype + ((local_400 & 4) == 0);
    local_370.geomdata.prob_domain.xhi[0] = (Real)CONCAT44(auStack_40c[1],auStack_40c[0]);
    local_370.geomdata.prob_domain.xhi[1]._0_4_ =
         local_390 + local_370.geomdata.prob_domain.xlo[2]._4_4_ + -1;
    local_370.geomdata.prob_domain.xhi[1]._4_4_ = local_400 & 0xfffffffb;
    lVar15 = 0;
    do {
      uVar30 = 1 << ((byte)lVar15 & 0x1f);
      uVar25 = (uint)lVar15;
      *(uint *)((long)local_370.geomdata.prob_domain.xhi + lVar15 * 4) =
           (*(int *)((long)local_370.geomdata.prob_domain.xhi + lVar15 * 4) +
           (uint)((uVar2 >> (uVar25 & 0x1f) & 1) != 0)) -
           (uint)((local_370.geomdata.prob_domain.xhi[1]._4_4_ >> (uVar25 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar25 & 0x1f) & 1) == 0) {
        local_370.geomdata.prob_domain.xhi[1]._4_4_ =
             ~uVar30 & local_370.geomdata.prob_domain.xhi[1]._4_4_;
      }
      else {
        local_370.geomdata.prob_domain.xhi[1]._4_4_ =
             uVar30 | local_370.geomdata.prob_domain.xhi[1]._4_4_;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_388 = local_388 + bcomp;
    lVar15 = 0;
    local_b8 = time;
    local_3a0 = numcomp;
    local_39c = dcomp;
    do {
      uVar14 = uStack_9c;
      uVar13 = uStack_a0;
      uVar12 = uStack_a4;
      uVar11 = local_a8;
      RVar10 = local_b8;
      uVar6 = local_d0._8_8_;
      uVar38 = *(ulong *)((long)local_370.domain.smallend.vect + lVar15 + -0x50);
      uVar7 = *(ulong *)((long)local_370.domain.smallend.vect + lVar15 + -0x44);
      uVar4 = *(undefined8 *)((long)(&local_370.domain.smallend + -5) + lVar15);
      local_3e8.smallend.vect[2] =
           (int)*(undefined8 *)((long)(&local_370.domain.smallend + -6) + lVar15);
      uVar37 = *(ulong *)(bx->smallend).vect;
      uVar36 = CONCAT44(-(uint)((int)(uVar37 >> 0x20) < (int)(uVar38 >> 0x20)),
                        -(uint)((int)uVar37 < (int)uVar38));
      uVar37 = ~uVar36 & uVar37 | uVar38 & uVar36;
      local_3e8.smallend.vect[0] = (int)uVar37;
      local_3e8.smallend.vect[1] = (int)(uVar37 >> 0x20);
      iVar16 = (bx->smallend).vect[2];
      if (iVar16 < local_3e8.smallend.vect[2]) {
        iVar16 = local_3e8.smallend.vect[2];
      }
      uVar37 = *(ulong *)(bx->bigend).vect;
      uVar38 = CONCAT44(-(uint)((int)(uVar7 >> 0x20) < (int)(uVar37 >> 0x20)),
                        -(uint)((int)uVar7 < (int)uVar37));
      uVar37 = ~uVar38 & uVar37 | uVar7 & uVar38;
      local_3e8.bigend.vect[0] = (int)uVar37;
      local_3e8.bigend.vect[1] = (int)(uVar37 >> 0x20);
      local_3e8.bigend.vect[2] = (int)uVar4;
      iVar27 = (bx->bigend).vect[2];
      if (local_3e8.bigend.vect[2] < iVar27) {
        iVar27 = local_3e8.bigend.vect[2];
      }
      local_3e8.btype.itype = (uint)((ulong)uVar4 >> 0x20);
      local_3e8.bigend.vect[2] = iVar27;
      local_240._8_4_ = SUB84(pdVar5,0);
      local_240._12_4_ = (undefined4)((ulong)pdVar5 >> 0x20);
      stack0xfffffffffffffdd0 = local_248;
      stack0xfffffffffffffdd8 = lVar18;
      local_220 = local_378;
      local_218.x = local_d0._0_4_;
      local_218.y = local_d0._4_4_;
      local_218.z = iVar28;
      local_20c = local_380;
      local_204 = (int)local_c0;
      iStack_200 = local_3b4;
      local_1fc[2] = local_3a0;
      local_1fc[1] = local_39c;
      aiStack_1e0[0] = local_25c[1];
      aiStack_1e0[1] = local_25c[2];
      IStack_1d8.itype = IStack_250.itype;
      local_1fc[3] = aiStack_268[0];
      iStack_1ec = aiStack_268[1];
      iStack_1e8 = iStack_260;
      uStack_1e4 = local_25c[0];
      local_1d0 = local_388;
      pRVar21 = &local_88;
      pRVar24 = (Real *)auStack_1c0;
      for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
        *pRVar24 = *pRVar21;
        pRVar21 = pRVar21 + (ulong)bVar31 * -2 + 1;
        pRVar24 = pRVar24 + (ulong)bVar31 * -2 + 1;
      }
      local_170 = (Real)CONCAT44(uVar12,uVar11);
      local_158 = local_3a4;
      local_154._4_4_ = local_3ac;
      local_154._0_4_ = local_3a8;
      local_14c = local_3b0;
      local_148 = SUB84(RVar10,0);
      iStack_144 = (int)((ulong)RVar10 >> 0x20);
      local_140 = orig_comp;
      local_3e8.smallend.vect[2] = iVar16;
      iStack_168 = uVar13;
      uStack_164 = uVar14;
      local_160 = (Real)uVar6;
      For<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::ccfcdoit<amrex::FilccCell>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilccCell&&)::_lambda(int,int,int)_1_>
                (&local_3e8,(anon_class_264_10_7336990c *)local_240);
      pdVar9 = local_e0;
      pBVar1 = local_e8;
      lVar17 = local_f0;
      iVar16 = local_3b4;
      lVar15 = lVar15 + 0x1c;
    } while (lVar15 != 0xa8);
    local_240._0_4_ = local_418 - (uint)local_3f0;
    local_240._4_4_ = IStack_414.itype - iVar19;
    local_240._8_4_ = iStack_410;
    local_240._12_4_ = local_418 + -1;
    stack0xfffffffffffffdd0 = CONCAT44(IStack_404.itype,IStack_414.itype - 1);
    auStack_22c._4_4_ = local_400 & 0xfffffffc;
    lVar15 = 0;
    do {
      uVar25 = 1 << ((byte)lVar15 & 0x1f);
      uVar30 = (uint)lVar15;
      *(uint *)(auStack_22c + lVar15 * 4 + -8) =
           (*(int *)(auStack_22c + lVar15 * 4 + -8) + (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0)) -
           (uint)(((uint)auStack_22c._4_4_ >> (uVar30 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
        auStack_22c._4_4_ = ~uVar25 & auStack_22c._4_4_;
      }
      else {
        auStack_22c._4_4_ = uVar25 | auStack_22c._4_4_;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    uVar30 = local_400 & 1 ^ 1;
    iVar28 = auStack_40c[0] + uVar30;
    aiStack_1e0[0] = (int)local_398 + iVar28 + -1;
    stack0xfffffffffffffdd8 = CONCAT44(iVar28,auStack_22c._4_4_);
    local_220 = CONCAT44(iStack_410,IStack_414.itype - iVar19);
    local_218.y = IStack_414.itype - 1;
    local_218.x = aiStack_1e0[0];
    local_218.z = IStack_404.itype;
    local_20c._0_4_ = local_400 & 0xfffffffc;
    lVar15 = 0;
    do {
      uVar20 = 1 << ((byte)lVar15 & 0x1f);
      uVar25 = (uint)lVar15;
      (&local_218.x)[lVar15] =
           ((&local_218.x)[lVar15] + (uint)((uVar2 >> (uVar25 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_20c >> (uVar25 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar25 & 0x1f) & 1) == 0) {
        local_20c._0_4_ = ~uVar20 & (uint)local_20c;
      }
      else {
        local_20c._0_4_ = uVar20 | (uint)local_20c;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_90 = local_398 & 0xffffffff;
    local_3c0 = (ulong)local_398._4_4_;
    iVar19 = (int)(local_400 << 0x1e) >> 0x1f;
    local_ac = local_400 >> 2;
    local_98 = CONCAT44(iStack_410,IStack_414.itype);
    local_20c._4_4_ = local_418 - (int)local_398;
    local_204 = auStack_40c[1] + iVar19 + 1;
    iStack_200 = iStack_410;
    local_1fc[0] = local_418 + -1;
    local_1fc[1] = auStack_40c[1] + iVar19 + local_398._4_4_;
    local_1fc[2] = IStack_404.itype;
    local_1fc[3] = local_400 & 0xfffffffc;
    lVar15 = 0;
    do {
      uVar20 = 1 << ((byte)lVar15 & 0x1f);
      uVar25 = (uint)lVar15;
      local_1fc[lVar15] =
           (local_1fc[lVar15] + (uint)((uVar2 >> (uVar25 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_1fc[3] >> (uVar25 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar25 & 0x1f) & 1) == 0) {
        local_1fc[3] = ~uVar20 & local_1fc[3];
      }
      else {
        local_1fc[3] = uVar20 | local_1fc[3];
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    iStack_1ec = iVar28;
    iStack_1e8 = auStack_40c[1] + iVar19 + 1;
    uStack_1e4 = iStack_410;
    IStack_1d8.itype = IStack_404.itype;
    aiStack_1e0[1] = auStack_40c[1] + iVar19 + local_398._4_4_;
    local_1d4 = local_400 & 0xfffffffc;
    lVar15 = 0;
    do {
      uVar25 = 1 << ((byte)lVar15 & 0x1f);
      uVar20 = (uint)lVar15;
      aiStack_1e0[lVar15] =
           (aiStack_1e0[lVar15] + (uint)((uVar2 >> (uVar20 & 0x1f) & 1) != 0)) -
           (uint)((local_1d4 >> (uVar20 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar20 & 0x1f) & 1) == 0) {
        local_1d4 = ~uVar25 & local_1d4;
      }
      else {
        local_1d4 = uVar25 | local_1d4;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_3c8 = CONCAT44(auStack_40c[1],auStack_40c[0]);
    local_1c4 = local_418 + -1;
    register0x00000014 = auStack_40c[1];
    local_1c8 = iStack_410 - local_390;
    local_130 = iStack_410 + -1;
    uStack_164 = local_400 & 0xfffffffa;
    local_1d0 = (BCRec *)CONCAT44(IStack_414.itype,local_418 - (int)local_398);
    local_1bc = local_130;
    local_1b8 = uStack_164;
    lVar15 = 0;
    do {
      uVar20 = 1 << ((byte)lVar15 & 0x1f);
      uVar25 = (uint)lVar15;
      (&local_1c4)[lVar15] =
           ((&local_1c4)[lVar15] + (uint)((uVar2 >> (uVar25 & 0x1f) & 1) != 0)) -
           (uint)((local_1b8 >> (uVar25 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar25 & 0x1f) & 1) == 0) {
        local_1b8 = ~uVar20 & local_1b8;
      }
      else {
        local_1b8 = uVar20 | local_1b8;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    uVar25 = local_400 >> 2 & 1;
    iVar26 = uVar30 + auStack_40c[0];
    local_1b4._4_4_ = IStack_414.itype;
    local_1b4._0_4_ = iVar26;
    local_170 = (Real)CONCAT44(auStack_40c[1],(int)local_398 + iVar26 + -1);
    local_1ac = local_1c8;
    local_1a8 = local_170;
    local_1a0 = local_130;
    local_19c = uStack_164;
    lVar15 = 0;
    do {
      uVar20 = 1 << ((byte)lVar15 & 0x1f);
      uVar30 = (uint)lVar15;
      *(uint *)((long)&local_1a8 + lVar15 * 4) =
           (*(int *)((long)&local_1a8 + lVar15 * 4) + (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0)) -
           (uint)((local_19c >> (uVar30 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
        local_19c = ~uVar20 & local_19c;
      }
      else {
        local_19c = uVar20 | local_19c;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    iVar28 = (uVar25 ^ 1) + IStack_404.itype;
    local_194._4_4_ = iVar28;
    local_194._0_4_ = IStack_414.itype;
    local_198 = local_418 - (int)local_398;
    local_18c[0] = local_418 + -1;
    local_18c[1] = auStack_40c[1];
    local_18c[2] = local_390 + iVar28 + -1;
    local_18c[3] = uStack_164;
    lVar15 = 0;
    do {
      uVar20 = 1 << ((byte)lVar15 & 0x1f);
      uVar30 = (uint)lVar15;
      local_18c[lVar15] =
           (local_18c[lVar15] + (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_18c[3] >> (uVar30 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
        local_18c[3] = ~uVar20 & local_18c[3];
      }
      else {
        local_18c[3] = uVar20 | local_18c[3];
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_174 = (IStack_404.itype + 1) - uVar25;
    local_18c[4] = iVar26;
    local_18c[5] = IStack_414.itype;
    iStack_168 = local_390 + local_174 + -1;
    lVar15 = 0;
    do {
      uVar30 = 1 << ((byte)lVar15 & 0x1f);
      uVar25 = (uint)lVar15;
      *(uint *)((long)&local_170 + lVar15 * 4) =
           (*(int *)((long)&local_170 + lVar15 * 4) + (uint)((uVar2 >> (uVar25 & 0x1f) & 1) != 0)) -
           (uint)((uStack_164 >> (uVar25 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar25 & 0x1f) & 1) == 0) {
        uStack_164 = ~uVar30 & uStack_164;
      }
      else {
        uStack_164 = uVar30 | uStack_164;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_11c[3] = local_400 & 0xfffffff9;
    local_160 = (Real)CONCAT44(IStack_414.itype - local_398._4_4_,local_418);
    local_158 = local_1c8;
    local_154 = ((ulong)IStack_414.itype << 0x20) - 0x100000000 | (ulong)auStack_40c[0];
    local_14c = local_130;
    local_148 = local_11c[3];
    lVar15 = 0;
    do {
      uVar25 = 1 << ((byte)lVar15 & 0x1f);
      uVar30 = (uint)lVar15;
      *(uint *)((long)&local_154 + lVar15 * 4) =
           (*(int *)((long)&local_154 + lVar15 * 4) + (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0)) -
           (uint)((local_148 >> (uVar30 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
        local_148 = ~uVar25 & local_148;
      }
      else {
        local_148 = uVar25 | local_148;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_140 = auStack_40c[1] + ((local_400 & 2) == 0);
    iStack_144 = local_418;
    local_13c = local_1c8;
    local_138 = CONCAT44(local_398._4_4_ + local_140 + -1,auStack_40c[0]);
    local_12c = local_11c[3];
    lVar15 = 0;
    do {
      uVar25 = 1 << ((byte)lVar15 & 0x1f);
      uVar30 = (uint)lVar15;
      *(uint *)((long)&local_138 + lVar15 * 4) =
           (*(int *)((long)&local_138 + lVar15 * 4) + (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0)) -
           (uint)((local_12c >> (uVar30 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
        local_12c = ~uVar25 & local_12c;
      }
      else {
        local_12c = uVar25 | local_12c;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    iVar28 = (int)(local_400 << 0x1d) >> 0x1f;
    local_128 = local_418;
    local_124 = IStack_414.itype - local_398._4_4_;
    local_120 = IStack_404.itype + 1 + iVar28;
    local_11c[0] = auStack_40c[0];
    local_11c[1] = IStack_414.itype - 1;
    local_11c[2] = iVar28 + IStack_404.itype + local_390;
    lVar15 = 0;
    do {
      uVar30 = 1 << ((byte)lVar15 & 0x1f);
      uVar25 = (uint)lVar15;
      local_11c[lVar15] =
           (local_11c[lVar15] + (uint)((uVar2 >> (uVar25 & 0x1f) & 1) != 0)) -
           (uint)((local_11c[3] >> (uVar25 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar25 & 0x1f) & 1) == 0) {
        local_11c[3] = ~uVar30 & local_11c[3];
      }
      else {
        local_11c[3] = uVar30 | local_11c[3];
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    iVar19 = (int)(local_400 << 0x1e) >> 0x1f;
    iVar28 = (int)(local_400 << 0x1d) >> 0x1f;
    local_10c = CONCAT44(auStack_40c[1] + iVar19 + 1,local_418);
    local_104 = IStack_404.itype + iVar28 + 1;
    local_100 = CONCAT44(local_398._4_4_ + auStack_40c[1] + iVar19,auStack_40c[0]);
    local_f8 = local_390 + IStack_404.itype + iVar28;
    local_f4 = local_400 & 0xfffffff9;
    lVar15 = 0;
    do {
      uVar30 = 1 << ((byte)lVar15 & 0x1f);
      uVar25 = (uint)lVar15;
      *(uint *)((long)&local_100 + lVar15 * 4) =
           (*(int *)((long)&local_100 + lVar15 * 4) + (uint)((uVar2 >> (uVar25 & 0x1f) & 1) != 0)) -
           (uint)((local_f4 >> (uVar25 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar25 & 0x1f) & 1) == 0) {
        local_f4 = ~uVar30 & local_f4;
      }
      else {
        local_f4 = uVar30 | local_f4;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    lVar15 = 0;
    local_3f0 = (ulong)IStack_404.itype;
    do {
      uVar14 = uStack_9c;
      uVar13 = uStack_a0;
      uVar12 = uStack_a4;
      uVar11 = local_a8;
      RVar10 = local_b8;
      uVar4 = local_d0._8_8_;
      uVar38 = *(ulong *)(local_240 + lVar15);
      uVar7 = *(ulong *)(local_240 + lVar15 + 0xc);
      local_3e8.smallend.vect[2] = (int)*(undefined8 *)(local_240 + lVar15 + 8);
      uVar37 = *(ulong *)(pBVar1->smallend).vect;
      uVar36 = CONCAT44(-(uint)((int)(uVar37 >> 0x20) < (int)(uVar38 >> 0x20)),
                        -(uint)((int)uVar37 < (int)uVar38));
      uVar37 = ~uVar36 & uVar37 | uVar38 & uVar36;
      local_3e8.smallend.vect[0] = (int)uVar37;
      local_3e8.smallend.vect[1] = (int)(uVar37 >> 0x20);
      iVar28 = (pBVar1->smallend).vect[2];
      if (iVar28 < local_3e8.smallend.vect[2]) {
        iVar28 = local_3e8.smallend.vect[2];
      }
      uVar37 = *(ulong *)(pBVar1->bigend).vect;
      uVar38 = CONCAT44(-(uint)((int)(uVar7 >> 0x20) < (int)(uVar37 >> 0x20)),
                        -(uint)((int)uVar7 < (int)uVar37));
      uVar37 = ~uVar38 & uVar37 | uVar7 & uVar38;
      local_3e8.bigend.vect[0] = (int)uVar37;
      local_3e8.bigend.vect[1] = (int)(uVar37 >> 0x20);
      local_3e8.bigend.vect[2] = (int)*(undefined8 *)(auStack_22c + lVar15);
      iVar19 = (pBVar1->bigend).vect[2];
      if (local_3e8.bigend.vect[2] < iVar19) {
        iVar19 = local_3e8.bigend.vect[2];
      }
      local_3e8.btype.itype = (uint)((ulong)*(undefined8 *)(auStack_22c + lVar15) >> 0x20);
      local_3e8.bigend.vect[2] = iVar19;
      local_370.fab.p._0_4_ = (int)pdVar9;
      local_370.fab.p._4_4_ = (int)((ulong)pdVar9 >> 0x20);
      local_370.fab.jstride._0_4_ = (int)local_248;
      local_370.fab.jstride._4_4_ = (uint)((ulong)local_248 >> 0x20);
      local_370.fab.kstride._0_4_ = (uint)lVar17;
      local_370.fab.kstride._4_4_ = (int)((ulong)lVar17 >> 0x20);
      local_370.fab.nstride._0_4_ = (int)local_378;
      local_370.fab.nstride._4_4_ = (int)((ulong)local_378 >> 0x20);
      local_370.fab.begin.x = (int)local_d0._0_8_;
      local_370.fab.begin.y = SUB84(local_d0._0_8_,4);
      local_370.fab.begin.z = (int)local_d8;
      local_370.fab.end.x = (int)local_380;
      local_370.fab.end.y = (int)(local_380 >> 0x20);
      local_370.fab.end.z = (int)local_c0;
      local_370.fab.ncomp = iVar16;
      local_370.dcomp = local_39c;
      local_370.numcomp = local_3a0;
      local_370.domain.bigend.vect[1] = local_25c[1];
      local_370.domain.bigend.vect[2] = (int)stack0xfffffffffffffdac;
      local_370.domain.btype.itype = SUB84(stack0xfffffffffffffdac,4);
      local_370.domain.smallend.vect[0] = aiStack_268[0];
      local_370.domain.smallend.vect[1] = aiStack_268[1];
      local_370.domain.smallend.vect[2] = iStack_260;
      local_370.domain.bigend.vect[0] = local_25c[0];
      local_370.bcr_p = local_388;
      pRVar21 = &local_88;
      pGVar23 = &local_370.geomdata;
      for (lVar29 = 10; lVar29 != 0; lVar29 = lVar29 + -1) {
        (pGVar23->prob_domain).xlo[0] = *pRVar21;
        pRVar21 = pRVar21 + (ulong)bVar31 * -2 + 1;
        pGVar23 = (GeometryData *)((long)pGVar23 + ((ulong)bVar31 * -2 + 1) * 8);
      }
      local_370.geomdata.dx[0] = (Real)CONCAT44(uVar12,uVar11);
      local_370.geomdata.is_periodic[0] = local_3a4;
      local_370.geomdata.is_periodic[1] = local_3a8;
      local_370.geomdata.is_periodic[2] = local_3ac;
      local_370.geomdata.coord = local_3b0;
      local_370.orig_comp = orig_comp;
      local_3e8.smallend.vect[2] = iVar28;
      local_370.geomdata.dx[1]._0_4_ = uVar13;
      local_370.geomdata.dx[1]._4_4_ = uVar14;
      local_370.geomdata.dx[2] = (Real)uVar4;
      local_370.time = RVar10;
      For<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::ccfcdoit<amrex::FilccCell>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilccCell&&)::_lambda(int,int,int)_2_>
                (&local_3e8,&local_370);
      pdVar5 = local_e0;
      pBVar8 = local_e8;
      lVar29 = local_f0;
      iVar28 = local_3b4;
      lVar15 = lVar15 + 0x1c;
    } while (lVar15 != 0x150);
    local_3c0 = local_398 & 0xffffffff;
    local_3c8 = (ulong)local_390;
    local_370.fab.p._0_4_ = iStack_410 - local_390;
    local_370.domain.btype.itype = iStack_410 - 1;
    local_370._0_4_ = local_418 - (int)local_398;
    local_370._4_4_ = IStack_414.itype - local_398._4_4_;
    local_370.fab.p._4_4_ = local_418 + -1;
    local_370.fab.jstride._0_4_ = (int)(((ulong)IStack_414.itype << 0x20) + -0x100000000 >> 0x20);
    local_370.fab.begin.y = (int)local_370.fab.jstride;
    local_370.fab.jstride._4_4_ = local_370.domain.btype.itype;
    local_3f0 = CONCAT44(local_3f0._4_4_,local_400) & 0xfffffffffffffff8;
    local_370.fab.kstride._0_4_ = local_400 & 0xfffffff8;
    lVar15 = 0;
    do {
      uVar25 = 1 << ((byte)lVar15 & 0x1f);
      uVar30 = (uint)lVar15;
      local_370.domain.smallend.vect[lVar15 + -0x11] =
           (local_370.domain.smallend.vect[lVar15 + -0x11] +
           (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_370.fab.kstride >> (uVar30 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
        local_370.fab.kstride._0_4_ = ~uVar25 & (uint)local_370.fab.kstride;
      }
      else {
        local_370.fab.kstride._0_4_ = uVar25 | (uint)local_370.fab.kstride;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_370.fab.kstride._4_4_ = auStack_40c[0] - (local_400 & 1);
    local_370.domain.bigend.vect[1] = (int)local_398 + local_370.fab.kstride._4_4_;
    local_370.fab.kstride._4_4_ = local_370.fab.kstride._4_4_ + 1;
    local_370.fab.nstride._0_4_ = IStack_414.itype - local_398._4_4_;
    local_370.fab.nstride._4_4_ = (int)local_370.fab.p;
    local_370.fab.begin.x = local_370.domain.bigend.vect[1];
    local_370.fab.begin.z = local_370.domain.btype.itype;
    local_370.fab.end.x = (uint)local_3f0;
    lVar15 = 0;
    do {
      uVar25 = 1 << ((byte)lVar15 & 0x1f);
      uVar30 = (uint)lVar15;
      local_370.domain.smallend.vect[lVar15 + -10] =
           (local_370.domain.smallend.vect[lVar15 + -10] +
           (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_370.fab.end.x >> (uVar30 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
        local_370.fab.end.x = ~uVar25 & local_370.fab.end.x;
      }
      else {
        local_370.fab.end.x = uVar25 | local_370.fab.end.x;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_240._0_4_ = local_418 - (int)local_398;
    local_240._8_4_ = iStack_410;
    iVar16 = (int)(local_400 << 0x1e) >> 0x1f;
    local_240._4_4_ = iVar16 + auStack_40c[1] + 1;
    local_370.fab.end.y = local_418 - (int)local_398;
    local_370.fab.end.z = local_240._4_4_;
    local_370.fab.ncomp = iStack_410 - local_390;
    local_370.fab._60_4_ = local_418 + -1;
    local_370.dcomp = iVar16 + auStack_40c[1] + local_398._4_4_;
    local_370.numcomp = iStack_410 + -1;
    local_370.domain.smallend.vect[0] = (uint)local_3f0;
    lVar15 = 0;
    do {
      uVar25 = 1 << ((byte)lVar15 & 0x1f);
      uVar30 = (uint)lVar15;
      *(uint *)((long)(&local_370.domain.smallend + -1) + lVar15 * 4) =
           (*(int *)((long)(&local_370.domain.smallend + -1) + lVar15 * 4) +
           (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_370.domain.smallend.vect[0] >> (uVar30 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
        local_370.domain.smallend.vect[0] = ~uVar25 & local_370.domain.smallend.vect[0];
      }
      else {
        local_370.domain.smallend.vect[0] = uVar25 | local_370.domain.smallend.vect[0];
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_370.domain.smallend.vect[1] = local_370.fab.kstride._4_4_;
    local_370.domain.smallend.vect[2] = auStack_40c[1] + iVar16 + 1;
    local_370.domain.bigend.vect[0] = (int)local_370.fab.p;
    local_370.domain.bigend.vect[2] = auStack_40c[1] + iVar16 + local_398._4_4_;
    local_370._108_4_ = (uint)local_3f0;
    lVar15 = 0;
    do {
      uVar25 = 1 << ((byte)lVar15 & 0x1f);
      uVar30 = (uint)lVar15;
      local_370.domain.bigend.vect[lVar15 + 1] =
           (local_370.domain.bigend.vect[lVar15 + 1] + (uint)((uVar2 >> (uVar30 & 0x1f) & 1) != 0))
           - (uint)(((uint)local_370._108_4_ >> (uVar30 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar30 & 0x1f) & 1) == 0) {
        local_370._108_4_ = ~uVar25 & local_370._108_4_;
      }
      else {
        local_370._108_4_ = uVar25 | local_370._108_4_;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_240._0_4_ = local_418 - (int)local_398;
    iVar19 = (int)(local_400 << 0x1d) >> 0x1f;
    local_370._120_4_ = iVar19 + IStack_404.itype + 1;
    local_370.geomdata.dx[1]._0_4_ = local_390 + iVar19 + IStack_404.itype;
    local_370.bcr_p = (BCRec *)CONCAT44(IStack_414.itype - local_398._4_4_,local_240._0_4_);
    local_370._124_4_ = local_418 + -1;
    local_370.geomdata.prob_domain.xlo[0]._0_4_ = IStack_414.itype - 1;
    local_370.geomdata.prob_domain.xlo[0]._4_4_ = local_370.geomdata.dx[1]._0_4_;
    local_370.geomdata.prob_domain.xlo[1]._0_4_ = (uint)local_3f0;
    lVar15 = 0;
    do {
      uVar30 = 1 << ((byte)lVar15 & 0x1f);
      uVar25 = (uint)lVar15;
      *(uint *)((long)(&local_370.domain + 1) + lVar15 * 4 + 0x10) =
           (*(int *)((long)(&local_370.domain + 1) + lVar15 * 4 + 0x10) +
           (uint)((uVar2 >> (uVar25 & 0x1f) & 1) != 0)) -
           (uint)((local_370.geomdata.prob_domain.xlo[1]._0_4_ >> (uVar25 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar25 & 0x1f) & 1) == 0) {
        local_370.geomdata.prob_domain.xlo[1]._0_4_ =
             ~uVar30 & local_370.geomdata.prob_domain.xlo[1]._0_4_;
      }
      else {
        local_370.geomdata.prob_domain.xlo[1]._0_4_ =
             uVar30 | local_370.geomdata.prob_domain.xlo[1]._0_4_;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    uVar30 = local_400 & 1 ^ 1;
    local_370.geomdata.prob_domain.xlo[1]._4_4_ = auStack_40c[0] + uVar30;
    local_370.geomdata.prob_domain.xlo[2]._0_4_ = IStack_414.itype - local_398._4_4_;
    local_370.geomdata.prob_domain.xlo[2]._4_4_ = local_370._120_4_;
    local_370.geomdata.prob_domain.xhi[0] =
         (Real)CONCAT44(IStack_414.itype - 1,
                        (int)local_398 + local_370.geomdata.prob_domain.xlo[1]._4_4_ + -1);
    local_370.geomdata.prob_domain.xhi[1]._0_4_ = local_370.geomdata.dx[1]._0_4_;
    local_370.geomdata.prob_domain.xhi[1]._4_4_ = (uint)local_3f0;
    lVar15 = 0;
    do {
      uVar25 = 1 << ((byte)lVar15 & 0x1f);
      uVar20 = (uint)lVar15;
      *(uint *)((long)local_370.geomdata.prob_domain.xhi + lVar15 * 4) =
           (*(int *)((long)local_370.geomdata.prob_domain.xhi + lVar15 * 4) +
           (uint)((uVar2 >> (uVar20 & 0x1f) & 1) != 0)) -
           (uint)((local_370.geomdata.prob_domain.xhi[1]._4_4_ >> (uVar20 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar20 & 0x1f) & 1) == 0) {
        local_370.geomdata.prob_domain.xhi[1]._4_4_ =
             ~uVar25 & local_370.geomdata.prob_domain.xhi[1]._4_4_;
      }
      else {
        local_370.geomdata.prob_domain.xhi[1]._4_4_ =
             uVar25 | local_370.geomdata.prob_domain.xhi[1]._4_4_;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    local_240._4_4_ = iVar16 + 1 + auStack_40c[1];
    local_370.geomdata.prob_domain.xhi[2] = (Real)CONCAT44(local_240._4_4_,local_240._0_4_);
    local_370.geomdata.domain.smallend.vect[0] = IStack_404.itype + iVar19 + 1;
    local_370.geomdata.domain.smallend.vect[1] = local_418 + -1;
    local_370.geomdata.domain.smallend.vect[2] = iVar16 + auStack_40c[1] + local_398._4_4_;
    local_370.geomdata.domain.bigend.vect[0] = iVar19 + IStack_404.itype + local_390;
    local_370.geomdata.domain.bigend.vect[1] = (uint)local_3f0;
    lVar15 = 0;
    do {
      uVar25 = 1 << ((byte)lVar15 & 0x1f);
      uVar20 = (uint)lVar15;
      local_370.geomdata.domain.smallend.vect[lVar15 + 1] =
           (local_370.geomdata.domain.smallend.vect[lVar15 + 1] +
           (uint)((uVar2 >> (uVar20 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_370.geomdata.domain.bigend.vect[1] >> (uVar20 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar20 & 0x1f) & 1) == 0) {
        local_370.geomdata.domain.bigend.vect[1] =
             ~uVar25 & local_370.geomdata.domain.bigend.vect[1];
      }
      else {
        local_370.geomdata.domain.bigend.vect[1] = uVar25 | local_370.geomdata.domain.bigend.vect[1]
        ;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    iVar22 = uVar30 + auStack_40c[0];
    local_370.geomdata.domain.bigend.vect[2] = iVar22;
    local_370.geomdata.domain.btype.itype = auStack_40c[1] + iVar16 + 1;
    local_370.geomdata._76_4_ = local_370._120_4_;
    local_370.geomdata.dx[0] =
         (Real)CONCAT44(iVar16 + auStack_40c[1] + local_398._4_4_,(int)local_398 + iVar22 + -1);
    local_370.geomdata.dx[1]._4_4_ = (uint)local_3f0;
    lVar15 = 0;
    do {
      uVar30 = 1 << ((byte)lVar15 & 0x1f);
      uVar25 = (uint)lVar15;
      *(uint *)((long)local_370.geomdata.dx + lVar15 * 4) =
           (*(int *)((long)local_370.geomdata.dx + lVar15 * 4) +
           (uint)((uVar2 >> (uVar25 & 0x1f) & 1) != 0)) -
           (uint)((local_370.geomdata.dx[1]._4_4_ >> (uVar25 & 0x1f) & 1) != 0);
      if ((uVar2 >> (uVar25 & 0x1f) & 1) == 0) {
        local_370.geomdata.dx[1]._4_4_ = ~uVar30 & local_370.geomdata.dx[1]._4_4_;
      }
      else {
        local_370.geomdata.dx[1]._4_4_ = uVar30 | local_370.geomdata.dx[1]._4_4_;
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    lVar15 = 0;
    do {
      uStack_164 = uStack_9c;
      iStack_168 = uStack_a0;
      uVar12 = uStack_a4;
      uVar11 = local_a8;
      RVar10 = local_b8;
      local_160 = (Real)local_d0._8_8_;
      uVar38 = *(ulong *)((long)local_370.domain.smallend.vect + lVar15 + -0x50);
      uVar7 = *(ulong *)((long)local_370.domain.smallend.vect + lVar15 + -0x44);
      uVar4 = *(undefined8 *)((long)(&local_370.domain.smallend + -5) + lVar15);
      local_3e8.smallend.vect[2] =
           (int)*(undefined8 *)((long)(&local_370.domain.smallend + -6) + lVar15);
      uVar37 = *(ulong *)(pBVar8->smallend).vect;
      uVar36 = CONCAT44(-(uint)((int)(uVar37 >> 0x20) < (int)(uVar38 >> 0x20)),
                        -(uint)((int)uVar37 < (int)uVar38));
      uVar37 = ~uVar36 & uVar37 | uVar38 & uVar36;
      local_3e8.smallend.vect[0] = (int)uVar37;
      local_3e8.smallend.vect[1] = (int)(uVar37 >> 0x20);
      iVar16 = (pBVar8->smallend).vect[2];
      if (iVar16 < local_3e8.smallend.vect[2]) {
        iVar16 = local_3e8.smallend.vect[2];
      }
      uVar37 = *(ulong *)(pBVar8->bigend).vect;
      uVar38 = CONCAT44(-(uint)((int)(uVar7 >> 0x20) < (int)(uVar37 >> 0x20)),
                        -(uint)((int)uVar7 < (int)uVar37));
      uVar37 = ~uVar38 & uVar37 | uVar7 & uVar38;
      local_3e8.bigend.vect[0] = (int)uVar37;
      local_3e8.bigend.vect[1] = (int)(uVar37 >> 0x20);
      local_3e8.bigend.vect[2] = (int)uVar4;
      iVar19 = (pBVar8->bigend).vect[2];
      if (local_3e8.bigend.vect[2] < iVar19) {
        iVar19 = local_3e8.bigend.vect[2];
      }
      local_3e8.btype.itype = (uint)((ulong)uVar4 >> 0x20);
      local_3e8.bigend.vect[2] = iVar19;
      local_240._8_4_ = SUB84(pdVar5,0);
      local_240._12_4_ = (undefined4)((ulong)pdVar5 >> 0x20);
      stack0xfffffffffffffdd0 = local_248;
      stack0xfffffffffffffdd8 = lVar29;
      local_220 = local_378;
      local_218.x = local_d0._0_4_;
      local_218.y = local_d0._4_4_;
      local_218.z = (int)local_d8;
      local_20c = local_380;
      local_204 = (int)local_c0;
      iStack_200 = iVar28;
      local_1fc[2] = local_3a0;
      local_1fc[1] = local_39c;
      aiStack_1e0[0] = local_25c[1];
      aiStack_1e0[1] = local_25c[2];
      IStack_1d8.itype = IStack_250.itype;
      local_1fc[3] = aiStack_268[0];
      iStack_1ec = aiStack_268[1];
      iStack_1e8 = iStack_260;
      uStack_1e4 = local_25c[0];
      local_1d0 = local_388;
      pRVar21 = &local_88;
      pRVar24 = (Real *)auStack_1c0;
      for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
        *pRVar24 = *pRVar21;
        pRVar21 = pRVar21 + (ulong)bVar31 * -2 + 1;
        pRVar24 = pRVar24 + (ulong)bVar31 * -2 + 1;
      }
      local_170 = (Real)CONCAT44(uVar12,uVar11);
      local_158 = local_3a4;
      local_154._4_4_ = local_3ac;
      local_154._0_4_ = local_3a8;
      local_14c = local_3b0;
      local_148 = SUB84(RVar10,0);
      iStack_144 = (int)((ulong)RVar10 >> 0x20);
      local_140 = orig_comp;
      local_3e8.smallend.vect[2] = iVar16;
      For<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>::ccfcdoit<amrex::FilccCell>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilccCell&&)::_lambda(int,int,int)_3_>
                (&local_3e8,(anon_class_264_10_7336990c *)local_240);
      lVar15 = lVar15 + 0x1c;
    } while (lVar15 != 0xe0);
  }
  return;
}

Assistant:

void
GpuBndryFuncFab<F>::ccfcdoit (Box const& bx, FArrayBox& dest,
                              const int dcomp, const int numcomp,
                              Geometry const& geom, const Real time,
                              const Vector<BCRec>& bcr, const int bcomp,
                              const int orig_comp, FF&& fillfunc)
{
    const IntVect& len = bx.length();

    IndexType idxType = bx.ixType();
    Box const& domain = amrex::convert(geom.Domain(),idxType);
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            gdomain.grow(idim,len[idim]);
        }
    }

    if (gdomain.contains(bx)) return;

    Array4<Real> const& fab = dest.array();
    const auto geomdata = geom.data();

#ifdef AMREX_USE_GPU
    AsyncArray<BCRec> bcr_aa(bcr.data()+bcomp, numcomp);
    BCRec* bcr_p = bcr_aa.data();

    const auto f_user = m_user_f;

    // fill on the faces first
    {
        Array<Box,2*AMREX_SPACEDIM> dom_face_boxes
            = { AMREX_D_DECL(amrex::convert(amrex::adjCellLo(gdomain, 0, len[0]),idxType),
                             amrex::convert(amrex::adjCellLo(gdomain, 1, len[1]),idxType),
                             amrex::convert(amrex::adjCellLo(gdomain, 2, len[2]),idxType)),
                AMREX_D_DECL(amrex::convert(amrex::adjCellHi(gdomain, 0, len[0]),idxType),
                             amrex::convert(amrex::adjCellHi(gdomain, 1, len[1]),idxType),
                             amrex::convert(amrex::adjCellHi(gdomain, 2, len[2]),idxType)) };

        Vector<Box> face_boxes;
        for (const Box& b : dom_face_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) face_boxes.push_back(tmp);
        }
        const int n_face_boxes = face_boxes.size();
        if (n_face_boxes == 1) {
            amrex::ParallelFor(face_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                AMREX_D_PICK(amrex::ignore_unused(j,k),amrex::ignore_unused(k),(void)0);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_face_boxes > 1) {
            AsyncArray<Box> face_boxes_aa(face_boxes.data(), n_face_boxes);
            Box* boxes_p = face_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : face_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_face_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }

#if (AMREX_SPACEDIM >= 2)
    // fill on the box edges
    {
#if (AMREX_SPACEDIM == 2)
        Array<Box,4> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType) }};
#else
        Array<Box,12> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType) }};
#endif
        Vector<Box> edge_boxes;
        for (const Box& b : dom_edge_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) edge_boxes.push_back(tmp);
        }
        const int n_edge_boxes = edge_boxes.size();
        if (n_edge_boxes == 1) {
            amrex::ParallelFor(edge_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                AMREX_D_PICK(amrex::ignore_unused(j,k),amrex::ignore_unused(k),(void)0);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_edge_boxes > 1) {
            AsyncArray<Box> edge_boxes_aa(edge_boxes.data(), n_edge_boxes);
            Box* boxes_p = edge_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : edge_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_edge_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // fill on corners
    {
        Array<Box,8> dom_corner_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType) }};

        Vector<Box> corner_boxes;
        for (const Box& b : dom_corner_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) corner_boxes.push_back(tmp);
        }
        const int n_corner_boxes = corner_boxes.size();
        if (n_corner_boxes == 1) {
            amrex::ParallelFor(corner_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_corner_boxes > 1) {
            AsyncArray<Box> corner_boxes_aa(corner_boxes.data(), n_corner_boxes);
            Box* boxes_p = corner_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : corner_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_corner_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#else
    BCRec const* bcr_p = bcr.data()+bcomp;

    const auto& f_user = m_user_f;

    // fill on the box faces first
    {
        Array<Box,2*AMREX_SPACEDIM> dom_face_boxes
            = {{ AMREX_D_DECL(amrex::convert(amrex::adjCellLo(gdomain, 0, len[0]),idxType),
                              amrex::convert(amrex::adjCellLo(gdomain, 1, len[1]),idxType),
                              amrex::convert(amrex::adjCellLo(gdomain, 2, len[2]),idxType)),
                 AMREX_D_DECL(amrex::convert(amrex::adjCellHi(gdomain, 0, len[0]),idxType),
                              amrex::convert(amrex::adjCellHi(gdomain, 1, len[1]),idxType),
                              amrex::convert(amrex::adjCellHi(gdomain, 2, len[2]),idxType)) }};

        for (const Box& b : dom_face_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }

#if (AMREX_SPACEDIM >= 2)
    // fill on the box edges
    {
#if (AMREX_SPACEDIM == 2)
        Array<Box,4> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType) }};
#else
        Array<Box,12> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType) }};
#endif

        for (const Box& b : dom_edge_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // fill on box corners
    {
        Array<Box,8> dom_corner_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType) }};

        for (const Box& b : dom_corner_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#endif
}